

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_> *
getPluckerCoord<float>
          (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           *__return_storage_ptr__,
          pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *lPair)

{
  pointer *ppMVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pMVar8;
  iterator __position;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,_6,_1,_0,_6,_1> l2;
  Matrix<float,_6,_1,_0,_6,_1> l1;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Matrix<float,_6,_1,_0,_6,_1> local_40;
  Matrix<float,_6,_1,_0,_6,_1> local_28;
  
  fVar2 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[0];
  local_64 = (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] - fVar2;
  fVar3 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[1];
  local_60 = (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[1] - fVar3;
  fVar4 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[2];
  local_5c = (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[2] - fVar4;
  fVar5 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0];
  local_70 = (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] - fVar5;
  fVar6 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  local_6c = (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[1] - fVar6;
  fVar7 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2];
  local_68 = (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[2] - fVar7;
  fVar12 = local_5c * local_5c + local_60 * local_60 + local_64 * local_64;
  if (0.0 < fVar12) {
    fVar12 = SQRT(fVar12);
    local_64 = local_64 / fVar12;
    local_60 = local_60 / fVar12;
    local_5c = local_5c / fVar12;
  }
  fVar12 = local_68 * local_68 + local_6c * local_6c + local_70 * local_70;
  if (0.0 < fVar12) {
    fVar12 = SQRT(fVar12);
    local_70 = local_70 / fVar12;
    local_6c = local_6c / fVar12;
    local_68 = local_68 / fVar12;
  }
  local_4c = local_60 * fVar4 - fVar3 * local_5c;
  local_48 = local_5c * fVar2 - fVar4 * local_64;
  local_44 = local_64 * fVar3 - fVar2 * local_60;
  local_58 = local_6c * fVar7 - fVar6 * local_68;
  local_54 = local_68 * fVar5 - fVar7 * local_70;
  local_50 = local_70 * fVar6 - fVar5 * local_6c;
  uVar10 = -((uint)((ulong)&local_28 >> 2) & 0x3fffffff) & 3;
  if ((uVar10 == 0) || (memcpy(&local_28,&local_64,(ulong)(uVar10 * 4)), uVar10 != 3)) {
    uVar11 = (ulong)(uVar10 << 2);
    memcpy((void *)((long)local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + uVar11),(void *)((long)&local_64 + uVar11),
           uVar11 ^ 0xc);
  }
  pfVar9 = local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array + 3;
  uVar10 = -((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 3;
  if ((uVar10 == 0) || (memcpy(pfVar9,&local_4c,(ulong)(uVar10 * 4)), uVar10 != 3)) {
    uVar11 = (ulong)(uVar10 << 2);
    memcpy((void *)((long)local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + uVar11 + 0xc),(void *)((long)&local_4c + uVar11),
           uVar11 ^ 0xc);
  }
  memcpy(&local_40,&local_70,0xc);
  pfVar9 = local_40.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array + 3;
  uVar10 = -((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 3;
  if ((uVar10 == 0) || (memcpy(pfVar9,&local_58,(ulong)(uVar10 * 4)), uVar10 != 3)) {
    uVar11 = (ulong)(uVar10 << 2);
    memcpy((void *)((long)local_40.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + uVar11 + 0xc),(void *)((long)&local_58 + uVar11),
           uVar11 ^ 0xc);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar8 = (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar8 == (pointer)0x0) {
    std::vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>::
    _M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>const&>
              ((vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                *)__return_storage_ptr__,(iterator)0x0,&local_28);
  }
  else {
    *(undefined8 *)
     ((pMVar8->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
     4) = local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array._16_8_;
    *(undefined8 *)
     (pMVar8->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array =
         local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._0_8_;
    *(undefined8 *)
     ((pMVar8->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
     2) = local_28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array._8_8_;
    ppMVar1 = &(__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>::
    _M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>const&>
              ((vector<Eigen::Matrix<float,6,1,0,6,1>,std::allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                *)__return_storage_ptr__,__position,&local_40);
  }
  else {
    *(undefined8 *)
     (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
      m_storage.m_data.array + 4) =
         local_40.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._16_8_;
    *(undefined8 *)
     ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
     m_storage.m_data.array =
         local_40.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._0_8_;
    *(undefined8 *)
     (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
      m_storage.m_data.array + 2) =
         local_40.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
         ._8_8_;
    ppMVar1 = &(__return_storage_ptr__->
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}